

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O0

void __thiscall FGLRenderer::CopyToBackbuffer(FGLRenderer *this,GL_IRECT *bounds,bool applyGamma)

{
  bool bVar1;
  undefined1 local_a4 [8];
  FGLPostProcessState savedState_1;
  GL_IRECT box;
  FGLPostProcessState savedState;
  FString local_28;
  byte local_19;
  GL_IRECT *pGStack_18;
  bool applyGamma_local;
  GL_IRECT *bounds_local;
  FGLRenderer *this_local;
  
  local_19 = applyGamma;
  pGStack_18 = bounds;
  bounds_local = (GL_IRECT *)this;
  F2DDrawer::Draw(this->m2DDrawer);
  F2DDrawer::Clear(this->m2DDrawer);
  FString::FString(&local_28,"CopyToBackbuffer");
  FGLDebug::PushGroup(&local_28);
  FString::~FString(&local_28);
  bVar1 = FGLRenderBuffers::IsEnabled();
  if (bVar1) {
    FGLPostProcessState::FGLPostProcessState((FGLPostProcessState *)&box.width);
    FGLRenderBuffers::BindOutputFB(this->mBuffers);
    if (pGStack_18 == (GL_IRECT *)0x0) {
      ClearBorders(this);
      savedState_1.blendDestRgb = (this->mOutputLetterbox).left;
      savedState_1.blendDestAlpha = (this->mOutputLetterbox).top;
      box.left = (this->mOutputLetterbox).width;
      box.top = (this->mOutputLetterbox).height;
    }
    else {
      savedState_1.blendDestRgb = pGStack_18->left;
      savedState_1.blendDestAlpha = pGStack_18->top;
      box.left = pGStack_18->width;
      box.top = pGStack_18->height;
    }
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    DrawPresentTexture(this,(GL_IRECT *)&savedState_1.blendDestRgb,(bool)(local_19 & 1));
    FGLPostProcessState::~FGLPostProcessState((FGLPostProcessState *)&box.width);
  }
  else if (pGStack_18 == (GL_IRECT *)0x0) {
    FGLPostProcessState::FGLPostProcessState((FGLPostProcessState *)local_a4);
    ClearBorders(this);
    FGLPostProcessState::~FGLPostProcessState((FGLPostProcessState *)local_a4);
  }
  FGLDebug::PopGroup();
  return;
}

Assistant:

void FGLRenderer::CopyToBackbuffer(const GL_IRECT *bounds, bool applyGamma)
{
	m2DDrawer->Draw();	// draw all pending 2D stuff before copying the buffer
	m2DDrawer->Clear();

	FGLDebug::PushGroup("CopyToBackbuffer");
	if (FGLRenderBuffers::IsEnabled())
	{
		FGLPostProcessState savedState;
		mBuffers->BindOutputFB();

		GL_IRECT box;
		if (bounds)
		{
			box = *bounds;
		}
		else
		{
			ClearBorders();
			box = mOutputLetterbox;
		}

		mBuffers->BindCurrentTexture(0);
		DrawPresentTexture(box, applyGamma);
	}
	else if (!bounds)
	{
		FGLPostProcessState savedState;
		ClearBorders();
	}
	FGLDebug::PopGroup();
}